

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O2

HTTP_CLIENT_RESULT
uhttp_client_execute_request
          (HTTP_CLIENT_HANDLE handle,HTTP_CLIENT_REQUEST_TYPE request_type,char *relative_path,
          HTTP_HEADERS_HANDLE http_header_handle,uchar *content,size_t content_len,
          ON_HTTP_REQUEST_CALLBACK on_request_callback,void *callback_ctx)

{
  uint uVar1;
  bool bVar2;
  HTTP_CLIENT_HANDLE pHVar3;
  int iVar4;
  HTTP_HEADERS_RESULT HVar5;
  int iVar6;
  LOGGER_LOG p_Var7;
  HTTP_CLIENT_REQUEST_TYPE *item;
  BUFFER_HANDLE handle_00;
  size_t sVar8;
  char *pcVar9;
  LIST_ITEM_HANDLE item_00;
  STRING_HANDLE pSVar10;
  int iVar11;
  size_t sVar12;
  HTTP_CLIENT_RESULT HVar13;
  char *pcVar14;
  ulong index;
  char *local_78;
  STRING_HANDLE local_70;
  HTTP_CLIENT_HANDLE local_68;
  ulong local_60;
  uint local_54;
  size_t headerCnt;
  char *local_48;
  char *local_40;
  char *local_38;
  
  if (((on_request_callback == (ON_HTTP_REQUEST_CALLBACK)0x0 || handle == (HTTP_CLIENT_HANDLE)0x0)
      || (content != (uchar *)0x0 && content_len == 0)) ||
     (content_len != 0 && content == (uchar *)0x0)) {
    p_Var7 = xlogging_get_log_function();
    HVar13 = HTTP_CLIENT_INVALID_ARG;
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return HTTP_CLIENT_INVALID_ARG;
    }
    pcVar14 = "Invalid parameter sent to execute_request";
    iVar4 = 0x511;
LAB_00104f02:
    (*p_Var7)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c",
              "uhttp_client_execute_request",iVar4,1,pcVar14);
    return HVar13;
  }
  (handle->recv_msg).on_request_callback = on_request_callback;
  (handle->recv_msg).user_ctx = callback_ctx;
  iVar4 = setup_init_recv_msg(&handle->recv_msg);
  if (iVar4 != 0) {
    p_Var7 = xlogging_get_log_function();
    HVar13 = HTTP_CLIENT_ERROR;
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return HTTP_CLIENT_ERROR;
    }
    pcVar14 = "Failure allocating http http_data items";
    iVar4 = 0x51c;
    goto LAB_00104f02;
  }
  item = (HTTP_CLIENT_REQUEST_TYPE *)calloc(1,0x20);
  if (item == (HTTP_CLIENT_REQUEST_TYPE *)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 != (LOGGER_LOG)0x0) {
      (*p_Var7)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"uhttp_client_execute_request",0x524,1,"Failure allocating http data items");
    }
    BUFFER_delete((handle->recv_msg).msg_body);
    (handle->recv_msg).msg_body = (BUFFER_HANDLE)0x0;
    HTTPHeaders_Free((handle->recv_msg).resp_header);
    (handle->recv_msg).resp_header = (HTTP_HEADERS_HANDLE)0x0;
    return HTTP_CLIENT_ERROR;
  }
  *item = request_type;
  local_40 = relative_path;
  if (content_len != 0) {
    handle_00 = BUFFER_create(content,content_len);
    *(BUFFER_HANDLE *)(item + 6) = handle_00;
    if (handle_00 != (BUFFER_HANDLE)0x0) goto LAB_0010503b;
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00105393;
    pcVar14 = "Failure allocating content buffer";
    iVar4 = 0x532;
    goto LAB_00104fdb;
  }
  handle_00 = (BUFFER_HANDLE)0x0;
LAB_0010503b:
  local_70 = STRING_new();
  *(STRING_HANDLE *)(item + 4) = local_70;
  if (local_70 == (STRING_HANDLE)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 != (LOGGER_LOG)0x0) {
      (*p_Var7)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"uhttp_client_execute_request",0x53c,1,"Failure allocating content buffer");
    }
    BUFFER_delete(handle_00);
    goto LAB_00105393;
  }
  local_48 = handle->host_name;
  uVar1 = handle->port_num;
  headerCnt = 0;
  if ((http_header_handle == (HTTP_HEADERS_HANDLE)0x0) ||
     (HVar5 = HTTPHeaders_GetHeaderCount(http_header_handle,&headerCnt), HVar5 == HTTP_HEADERS_OK))
  {
    local_60 = 0;
    iVar4 = 0;
    local_68 = handle;
    local_54 = uVar1;
    for (index = 0; (pcVar14 = local_48, iVar4 == 0 && (index < headerCnt)); index = index + 1) {
      HVar5 = HTTPHeaders_GetHeader(http_header_handle,index,&local_78);
      pcVar14 = local_78;
      if (HVar5 == HTTP_HEADERS_OK) {
        sVar8 = strlen(local_78);
        sVar12 = sVar8 + 3;
        if (0xfffffffffffffffc < sVar8) {
          sVar12 = 0xffffffffffffffff;
        }
        if ((sVar12 == 0xffffffffffffffff) ||
           (pcVar9 = (char *)malloc(sVar12), pcVar9 == (char *)0x0)) {
          p_Var7 = xlogging_get_log_function();
          iVar4 = 0x378;
          if (p_Var7 != (LOGGER_LOG)0x0) {
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"construct_http_headers",0x379,1,"Failed in allocating header data, size:%zu"
                      ,sVar12);
          }
        }
        else {
          iVar6 = strcmp(pcVar14,"Host");
          iVar4 = snprintf(pcVar9,sVar12,"%s\r\n",pcVar14);
          local_38 = pcVar9;
          if (iVar4 < 1) {
            p_Var7 = xlogging_get_log_function();
            iVar4 = 900;
            if (p_Var7 != (LOGGER_LOG)0x0) {
              iVar11 = 0x385;
              pcVar14 = "Failed in constructing header data";
LAB_00105262:
              (*p_Var7)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"construct_http_headers",iVar11,1,pcVar14);
            }
          }
          else {
            iVar4 = STRING_concat(local_70,pcVar9);
            if (iVar4 == 0) {
              iVar4 = 0;
            }
            else {
              p_Var7 = xlogging_get_log_function();
              iVar4 = 0x38b;
              if (p_Var7 != (LOGGER_LOG)0x0) {
                iVar11 = 0x38c;
                pcVar14 = "Failed in building header data";
                goto LAB_00105262;
              }
            }
          }
          local_60 = CONCAT71((int7)(local_60 >> 8),(byte)local_60 | iVar6 == 0);
          free(local_38);
        }
        free(local_78);
      }
      else {
        p_Var7 = xlogging_get_log_function();
        iVar4 = 0x36c;
        if (p_Var7 != (LOGGER_LOG)0x0) {
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"construct_http_headers",0x36d,1,"Failed in HTTPHeaders_GetHeader");
        }
      }
    }
    if ((local_60 & 1) == 0) {
      sVar8 = strlen(local_48);
      sVar12 = sVar8 + 0x17;
      if (0xffffffffffffffe8 < sVar8) {
        sVar12 = 0xffffffffffffffff;
      }
      if ((sVar12 == 0xffffffffffffffff) || (pcVar9 = (char *)malloc(sVar12), pcVar9 == (char *)0x0)
         ) {
        p_Var7 = xlogging_get_log_function();
        handle = local_68;
        if (p_Var7 != (LOGGER_LOG)0x0) {
          pcVar14 = "Failed allocating host header, size:%zu";
          iVar4 = 0x3a0;
          goto LAB_001055d9;
        }
        goto LAB_001055de;
      }
      iVar6 = snprintf(pcVar9,sVar12,"%s: %s:%d\r\n","Host",pcVar14,(ulong)local_54);
      if (iVar6 < 1) {
        p_Var7 = xlogging_get_log_function();
        iVar4 = 0x3a8;
        if (p_Var7 != (LOGGER_LOG)0x0) {
          pcVar14 = "Failed constructing host header";
          iVar6 = 0x3a7;
LAB_00105464:
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"construct_http_headers",iVar6,1,pcVar14);
        }
      }
      else {
        iVar6 = STRING_concat(local_70,pcVar9);
        if (iVar6 != 0) {
          p_Var7 = xlogging_get_log_function();
          iVar4 = 0x3ad;
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar14 = "Failed adding the host header to the http item";
            iVar6 = 0x3ac;
            goto LAB_00105464;
          }
        }
      }
      free(pcVar9);
    }
    handle = local_68;
    if (iVar4 == 0) {
      pcVar14 = (char *)malloc(0x2a);
      if (pcVar14 == (char *)0x0) {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 == (LOGGER_LOG)0x0) {
          bVar2 = false;
        }
        else {
          bVar2 = false;
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"construct_http_headers",0x3bd,1,"Failed allocating chunk header, size:%zu",
                    0x2a);
        }
      }
      else {
        iVar4 = sprintf(pcVar14,"%s: %u%s","content-length",content_len & 0xffffffff,"\r\n");
        if (iVar4 < 1) {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar9 = "Failed allocating content len header data";
            iVar4 = 0x3c6;
            goto LAB_00105579;
          }
LAB_00105580:
          bVar2 = false;
        }
        else {
          iVar4 = STRING_concat(local_70,pcVar14);
          if (iVar4 == 0) {
            bVar2 = true;
          }
          else {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00105580;
            pcVar9 = "Failed building content len header data";
            iVar4 = 0x3cd;
LAB_00105579:
            bVar2 = false;
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"construct_http_headers",iVar4,1,pcVar9);
          }
        }
        free(pcVar14);
      }
      iVar4 = STRING_concat(local_70,"\r\n");
      if (iVar4 == 0) {
        if (bVar2) {
          item_00 = singlylinkedlist_add(handle->data_list,item);
          if (item_00 == (LIST_ITEM_HANDLE)0x0) {
            STRING_delete(*(STRING_HANDLE *)(item + 4));
            BUFFER_delete(*(BUFFER_HANDLE *)(item + 6));
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              pcVar14 = "Failure adding send data to list";
              iVar4 = 0x555;
LAB_00104fdb:
              (*p_Var7)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"uhttp_client_execute_request",iVar4,1,pcVar14);
            }
          }
          else {
            if (local_40 == (char *)0x0) {
              pSVar10 = STRING_construct("/");
              *(STRING_HANDLE *)(item + 2) = pSVar10;
              if (pSVar10 != (STRING_HANDLE)0x0) {
                return HTTP_CLIENT_OK;
              }
              singlylinkedlist_remove(handle->data_list,item_00);
              STRING_delete(*(STRING_HANDLE *)(item + 4));
              BUFFER_delete(*(BUFFER_HANDLE *)(item + 6));
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"uhttp_client_execute_request",0x57b,1,
                          "Failure allocating relative path buffer");
              }
              pHVar3 = local_68;
              BUFFER_delete((local_68->recv_msg).msg_body);
              (pHVar3->recv_msg).msg_body = (BUFFER_HANDLE)0x0;
              HTTPHeaders_Free((pHVar3->recv_msg).resp_header);
              (pHVar3->recv_msg).resp_header = (HTTP_HEADERS_HANDLE)0x0;
              goto LAB_00105643;
            }
            pSVar10 = STRING_construct(local_40);
            *(STRING_HANDLE *)(item + 2) = pSVar10;
            if (pSVar10 != (STRING_HANDLE)0x0) {
              return HTTP_CLIENT_OK;
            }
            singlylinkedlist_remove(handle->data_list,item_00);
            STRING_delete(*(STRING_HANDLE *)(item + 4));
            BUFFER_delete(*(BUFFER_HANDLE *)(item + 6));
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              pcVar14 = "Failure allocating relative path buffer";
              iVar4 = 0x566;
              goto LAB_00104fdb;
            }
          }
LAB_00105393:
          BUFFER_delete((handle->recv_msg).msg_body);
          (handle->recv_msg).msg_body = (BUFFER_HANDLE)0x0;
          HTTPHeaders_Free((handle->recv_msg).resp_header);
          (handle->recv_msg).resp_header = (HTTP_HEADERS_HANDLE)0x0;
          goto LAB_00105643;
        }
      }
      else {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          pcVar14 = "Failed sending header finalization data";
          iVar4 = 0x3d6;
          goto LAB_001055d9;
        }
      }
    }
  }
  else {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 != (LOGGER_LOG)0x0) {
      pcVar14 = "Failed in HTTPHeaders_GetHeaderCount";
      iVar4 = 0x361;
LAB_001055d9:
      (*p_Var7)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"construct_http_headers",iVar4,1,pcVar14);
    }
  }
LAB_001055de:
  p_Var7 = xlogging_get_log_function();
  if (p_Var7 != (LOGGER_LOG)0x0) {
    (*p_Var7)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c",
              "uhttp_client_execute_request",0x547,1,"Failure allocating content buffer");
  }
  BUFFER_delete(handle_00);
  STRING_delete(local_70);
  BUFFER_delete((handle->recv_msg).msg_body);
  (handle->recv_msg).msg_body = (BUFFER_HANDLE)0x0;
  HTTPHeaders_Free((handle->recv_msg).resp_header);
  (handle->recv_msg).resp_header = (HTTP_HEADERS_HANDLE)0x0;
LAB_00105643:
  free(item);
  return HTTP_CLIENT_ERROR;
}

Assistant:

HTTP_CLIENT_RESULT uhttp_client_execute_request(HTTP_CLIENT_HANDLE handle, HTTP_CLIENT_REQUEST_TYPE request_type, const char* relative_path,
    HTTP_HEADERS_HANDLE http_header_handle, const unsigned char* content, size_t content_len, ON_HTTP_REQUEST_CALLBACK on_request_callback, void* callback_ctx)
{
    HTTP_CLIENT_RESULT result;
    LIST_ITEM_HANDLE list_item;

    /* Codes_SRS_UHTTP_07_012: [If handle, relativePath, or httpHeadersHandle is NULL then http_client_execute_request shall return HTTP_CLIENT_INVALID_ARG] */
    if (handle == NULL || on_request_callback == NULL ||
        (content != NULL && content_len == 0) || (content == NULL && content_len != 0) )
    {
        result = HTTP_CLIENT_INVALID_ARG;
        LogError("Invalid parameter sent to execute_request");
    }
    else
    {
        HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)handle;

        http_data->recv_msg.on_request_callback = on_request_callback;
        http_data->recv_msg.user_ctx = callback_ctx;
        if (setup_init_recv_msg(&http_data->recv_msg) != 0)
        {
            /* Codes_SRS_UHTTP_07_017: [If any failure encountered http_client_execute_request shall return HTTP_CLIENT_ERROR] */
            LogError("Failure allocating http http_data items");
            result = HTTP_CLIENT_ERROR;
        }
        else
        {
            HTTP_SEND_DATA* send_data = (HTTP_SEND_DATA*)malloc(sizeof(HTTP_SEND_DATA));
            if (send_data == NULL)
            {
                LogError("Failure allocating http data items");
                BUFFER_delete(http_data->recv_msg.msg_body);
                http_data->recv_msg.msg_body = NULL;
                HTTPHeaders_Free(http_data->recv_msg.resp_header);
                http_data->recv_msg.resp_header = NULL;
                result = HTTP_CLIENT_ERROR;
            }
            else
            {
                memset(send_data, 0, sizeof(HTTP_SEND_DATA));
                /* Codes_SRS_UHTTP_07_041: [HTTP_CLIENT_REQUEST_TYPE shall support all request types specified under section 9.1.2 in the spec.] */
                send_data->request_type = request_type;
                if ( (content_len > 0) && (send_data->content = BUFFER_create(content, content_len)) == NULL)
                {
                    LogError("Failure allocating content buffer");
                    result = HTTP_CLIENT_ERROR;
                    BUFFER_delete(http_data->recv_msg.msg_body);
                    http_data->recv_msg.msg_body = NULL;
                    HTTPHeaders_Free(http_data->recv_msg.resp_header);
                    http_data->recv_msg.resp_header = NULL;
                    free(send_data);
                }
                else if ((send_data->header_line = STRING_new()) == NULL)
                {
                    LogError("Failure allocating content buffer");
                    result = HTTP_CLIENT_ERROR;
                    BUFFER_delete(send_data->content);
                    BUFFER_delete(http_data->recv_msg.msg_body);
                    http_data->recv_msg.msg_body = NULL;
                    HTTPHeaders_Free(http_data->recv_msg.resp_header);
                    http_data->recv_msg.resp_header = NULL;
                    free(send_data);
                }
                else if (construct_http_headers(http_header_handle, content_len, send_data->header_line, false, http_data->host_name, http_data->port_num))
                {
                    LogError("Failure allocating content buffer");
                    result = HTTP_CLIENT_ERROR;
                    BUFFER_delete(send_data->content);
                    STRING_delete(send_data->header_line);
                    BUFFER_delete(http_data->recv_msg.msg_body);
                    http_data->recv_msg.msg_body = NULL;
                    HTTPHeaders_Free(http_data->recv_msg.resp_header);
                    http_data->recv_msg.resp_header = NULL;
                    free(send_data);
                }
                else if ((list_item = singlylinkedlist_add(http_data->data_list, send_data)) == NULL)
                {
                    STRING_delete(send_data->header_line);
                    BUFFER_delete(send_data->content);
                    LogError("Failure adding send data to list");
                    result = HTTP_CLIENT_ERROR;
                    BUFFER_delete(http_data->recv_msg.msg_body);
                    http_data->recv_msg.msg_body = NULL;
                    HTTPHeaders_Free(http_data->recv_msg.resp_header);
                    http_data->recv_msg.resp_header = NULL;
                    free(send_data);
                }
                else
                {
                    if (relative_path != NULL)
                    {
                        if ((send_data->relative_path = STRING_construct(relative_path)) == NULL)
                        {
                            (void)singlylinkedlist_remove(http_data->data_list, list_item);
                            STRING_delete(send_data->header_line);
                            BUFFER_delete(send_data->content);
                            LogError("Failure allocating relative path buffer");
                            BUFFER_delete(http_data->recv_msg.msg_body);
                            http_data->recv_msg.msg_body = NULL;
                            HTTPHeaders_Free(http_data->recv_msg.resp_header);
                            http_data->recv_msg.resp_header = NULL;
                            free(send_data);
                            result = HTTP_CLIENT_ERROR;
                        }
                        else
                        {
                            /* Codes_SRS_UHTTP_07_018: [upon success http_client_execute_request shall return HTTP_CLIENT_OK.] */
                            result = HTTP_CLIENT_OK;
                        }
                    }
                    else
                    {
                        if ((send_data->relative_path = STRING_construct("/")) == NULL)
                        {
                            (void)singlylinkedlist_remove(http_data->data_list, list_item);
                            STRING_delete(send_data->header_line);
                            BUFFER_delete(send_data->content);
                            LogError("Failure allocating relative path buffer");
                            BUFFER_delete(http_data->recv_msg.msg_body);
                            http_data->recv_msg.msg_body = NULL;
                            HTTPHeaders_Free(http_data->recv_msg.resp_header);
                            http_data->recv_msg.resp_header = NULL;
                            free(send_data);
                            result = HTTP_CLIENT_ERROR;
                        }
                        else
                        {
                            /* Codes_SRS_UHTTP_07_018: [upon success http_client_execute_request shall return HTTP_CLIENT_OK.] */
                            result = HTTP_CLIENT_OK;
                        }
                    }
                }
            }
        }
    }
    return result;
}